

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

void __thiscall
internal_sparse_matrix::writeSparseMatrix<true>(internal_sparse_matrix *this,ostream *os)

{
  TasGrid::IO::writeNumbers<true,(TasGrid::IO::IOPad)3,int,int,int>
            (os,(int)((ulong)((long)(this->pntr).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->pntr).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2) + -1,
             this->num_cols,
             (int)((ulong)((long)(this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2));
  std::ostream::write((char *)os,
                      (long)(this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
  std::ostream::write((char *)os,
                      (long)(this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
  std::ostream::write((char *)os,
                      (long)(this->vals).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
  return;
}

Assistant:

void writeSparseMatrix(std::ostream &os) const{
        int nnz = static_cast<int>(indx.size());
        int rows = static_cast<int>(pntr.size() - 1);
        IO::writeNumbers<iomode, IO::pad_line>(os, rows, num_cols, nnz);
        IO::writeVector<iomode, IO::pad_line>(pntr, os);
        IO::writeVector<iomode, IO::pad_line>(indx, os);
        IO::writeVector<iomode, IO::pad_line>(vals, os);
    }